

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O0

bool __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::retrieve_symbol_walk
          (dwarf_resolver *this,die_object *cu_die,die_object *die,Dwarf_Addr pc,
          Dwarf_Half dwversion,stacktrace_frame *frame,
          vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *inlines)

{
  anon_class_56_7_8be982a3 local_98;
  function<bool_(const_cpptrace::detail::libdwarf::die_object_&)> local_60;
  bool local_39;
  stacktrace_frame *psStack_38;
  bool found;
  stacktrace_frame *frame_local;
  Dwarf_Addr DStack_28;
  Dwarf_Half dwversion_local;
  Dwarf_Addr pc_local;
  die_object *die_local;
  die_object *cu_die_local;
  dwarf_resolver *this_local;
  
  local_39 = false;
  local_98.inlines = inlines;
  local_98.found = &local_39;
  local_98.this = this;
  local_98.cu_die = cu_die;
  local_98.pc = pc;
  local_98.dwversion = dwversion;
  local_98.frame = frame;
  psStack_38 = frame;
  frame_local._6_2_ = dwversion;
  DStack_28 = pc;
  pc_local = (Dwarf_Addr)die;
  die_local = cu_die;
  cu_die_local = (die_object *)this;
  std::function<bool(cpptrace::detail::libdwarf::die_object_const&)>::
  function<cpptrace::detail::libdwarf::dwarf_resolver::retrieve_symbol_walk(cpptrace::detail::libdwarf::die_object_const&,cpptrace::detail::libdwarf::die_object_const&,unsigned_long_long,unsigned_short,cpptrace::stacktrace_frame&,std::vector<cpptrace::stacktrace_frame,std::allocator<cpptrace::stacktrace_frame>>&)::_lambda(cpptrace::detail::libdwarf::die_object_const&)_1_,void>
            ((function<bool(cpptrace::detail::libdwarf::die_object_const&)> *)&local_60,&local_98);
  walk_die_list(die,&local_60);
  std::function<bool_(const_cpptrace::detail::libdwarf::die_object_&)>::~function(&local_60);
  return (bool)(local_39 & 1);
}

Assistant:

CPPTRACE_FORCE_NO_INLINE_FOR_PROFILING
        bool retrieve_symbol_walk(
            const die_object& cu_die,
            const die_object& die,
            Dwarf_Addr pc,
            Dwarf_Half dwversion,
            stacktrace_frame& frame,
            std::vector<stacktrace_frame>& inlines
        ) {
            bool found = false;
            walk_die_list(
                die,
                [this, &cu_die, pc, dwversion, &frame, &inlines, &found] (const die_object& die) {
                    if(dump_dwarf) {
                        std::fprintf(
                            stderr,
                            "-------------> %08llx %s %s\n",
                            to_ull(die.get_global_offset()),
                            die.get_tag_name(),
                            die.get_name().c_str()
                        );
                    }
                    if(!(die.get_tag() == DW_TAG_namespace || die.pc_in_die(cu_die, dwversion, pc))) {
                        if(dump_dwarf) {
                            std::fprintf(stderr, "pc not in die\n");
                        }
                    } else {
                        if(trace_dwarf) {
                            std::fprintf(
                                stderr,
                                "%s %08llx %s\n",
                                die.get_tag() == DW_TAG_namespace ? "pc maybe in die (namespace)" : "pc in die",
                                to_ull(die.get_global_offset()),
                                die.get_tag_name()
                            );
                        }
                        if(die.get_tag() == DW_TAG_subprogram) {
                            frame.symbol = retrieve_symbol_for_subprogram(cu_die, die, pc, dwversion, inlines);
                            found = true;
                            return false;
                        }
                        auto child = die.get_child();
                        if(child) {
                            if(retrieve_symbol_walk(cu_die, child, pc, dwversion, frame, inlines)) {
                                found = true;
                                return false;
                            }
                        } else {
                            if(dump_dwarf) {
                                std::fprintf(stderr, "(no child)\n");
                            }
                        }
                    }
                    return true;
                }
            );
            if(dump_dwarf) {
                std::fprintf(stderr, "End walk_die_list\n");
            }
            return found;
        }